

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O1

void __thiscall
trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::discard
          (lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *this,unsigned_long_long n)

{
  int iVar1;
  GF2 *__cur;
  unsigned_long_long uVar2;
  long lVar3;
  void *__s;
  void *__s_00;
  pointer pGVar4;
  ulong uVar5;
  result_type_conflict sum;
  uint uVar6;
  uint uVar7;
  value_type_conflict4 *__val_1;
  long lVar8;
  size_type i;
  value_type_conflict4 *__val;
  pointer local_68;
  pointer pGStack_60;
  pointer local_58;
  matrix<trng::GF2,_521UL> local_48;
  
  uVar2 = int_math::log2_ceil<unsigned_long_long>(n);
  if (uVar2 * 0x86de8d9 < n) {
    local_68 = (pointer)0x0;
    pGStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    local_68 = (pointer)operator_new(0x42451);
    lVar8 = (long)local_68 + 0x42451;
    pGStack_60 = local_68;
    local_58 = (pointer)lVar8;
    memset(local_68,0,0x42451);
    lVar3 = 1;
    do {
      *(undefined1 *)((long)local_68 + lVar3) = 1;
      lVar3 = lVar3 + 0x20a;
    } while (lVar3 != 0x42451);
    *(undefined1 *)((long)local_68 + 0x42248) = 1;
    *(undefined1 *)((long)local_68 + 0x4235f) = 1;
    *(undefined1 *)((long)local_68 + 0x42384) = 1;
    *(undefined1 *)((long)local_68 + 0x423a9) = 1;
    pGStack_60 = (pointer)lVar8;
    power<trng::GF2,521ul>
              (&local_48,(trng *)&local_68,(matrix<trng::GF2,_521UL> *)(n - 0x209),
               CONCAT71((int7)((ulong)local_68 >> 8),1));
    pGVar4 = local_68;
    local_68 = local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
               super__Vector_impl_data._M_start;
    pGStack_60 = local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    local_58 = local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pGVar4 != (pointer)0x0) {
      operator_delete(pGVar4);
    }
    if (local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    __s = operator_new(0x824);
    lVar8 = 0;
    memset(__s,0,0x824);
    uVar6 = (this->S).index;
    do {
      *(result_type_conflict *)((long)__s + lVar8 * 4 + 0x820) =
           (this->S).r[uVar6 + (int)lVar8 & 0x3ff];
      lVar8 = lVar8 + -1;
    } while (lVar8 != -0x209);
    __s_00 = operator_new(0x824);
    lVar8 = 0;
    memset(__s_00,0,0x824);
    pGVar4 = local_68;
    do {
      lVar3 = 0;
      uVar6 = 0;
      do {
        uVar7 = 0;
        if (pGVar4[lVar3].value != '\0') {
          uVar7 = *(uint *)((long)__s + lVar3 * 4);
        }
        uVar6 = uVar6 ^ uVar7;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x209);
      *(uint *)((long)__s_00 + lVar8 * 4) = uVar6;
      lVar8 = lVar8 + 1;
      pGVar4 = pGVar4 + 0x209;
    } while (lVar8 != 0x209);
    uVar6 = (int)(matrix<trng::GF2,_521UL> *)(n - 0x209) + (this->S).index;
    (this->S).index = uVar6 & 0x3ff;
    lVar8 = 0;
    do {
      (this->S).r[uVar6 + (int)lVar8 & 0x3ff] =
           *(result_type_conflict *)((long)__s_00 + lVar8 * 4 + 0x820);
      lVar8 = lVar8 + -1;
    } while (lVar8 != -0x209);
    operator_delete(__s_00);
    operator_delete(__s);
    if (local_68 != (pointer)0x0) {
      operator_delete(local_68);
    }
    n = 0x209;
  }
  if (n != 0) {
    uVar5 = (ulong)(this->S).index;
    do {
      iVar1 = (int)uVar5;
      uVar6 = iVar1 + 1U & 0x3ff;
      uVar5 = (ulong)uVar6;
      (this->S).r[uVar5] =
           (this->S).r[iVar1 + 0x334U & 0x3ff] ^ (this->S).r[iVar1 + 0x359U & 0x3ff] ^
           (this->S).r[iVar1 + 0x30fU & 0x3ff] ^ (this->S).r[iVar1 + 0x1f8U & 0x3ff];
      n = n - 1;
    } while (n != 0);
    (this->S).index = uVar6;
  }
  return;
}

Assistant:

void discard(unsigned long long n) {
      const unsigned int matrix_size = D;
      using matrix_type = matrix<GF2, matrix_size>;
      using vector_type = vector<result_type, matrix_size>;
      using size_type = typename matrix_type::size_type;
      const unsigned long long n_pivot{int_math::log2_ceil(n) * D * D * D};
      constexpr auto mask = int_math::mask(D);
      if (n > n_pivot) {
        const unsigned long long n_partial{n - matrix_size};
        matrix_type M;
        for (size_type i{0}; i < matrix_size - 1; ++i)
          M(i, i + 1) = GF2(true);
        M(matrix_size - 1, matrix_size - D) = GF2(true);
        M(matrix_size - 1, matrix_size - C) = GF2(true);
        M(matrix_size - 1, matrix_size - B) = GF2(true);
        M(matrix_size - 1, matrix_size - A) = GF2(true);
        M = power(M, n_partial);
        vector_type V;
        for (size_type i{0}; i < matrix_size; ++i)
          V(matrix_size - 1 - i) = S.r[(S.index - i) & mask];
        vector_type W;
        for (size_type i{0}; i < matrix_size; ++i) {
          result_type sum{};
          for (size_type k{0}; k < matrix_size; ++k)
            sum ^= M(i, k) * V(k);
          W(i) = sum;
        }
        S.index = static_cast<unsigned int>(S.index + n_partial);
        S.index &= mask;
        for (size_type i{0}; i < matrix_size; ++i)
          S.r[(S.index - i) & mask] = W(matrix_size - 1 - i);
        n -= n_partial;
      }
      for (unsigned long long i{0}; i < n; ++i)
        step();
    }